

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialog::setOptions(QColorDialog *this,ColorDialogOptions options)

{
  QColorDialogPrivate *this_00;
  QPushButton *pQVar1;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> QVar2;
  
  this_00 = *(QColorDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar2.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
       (QFlagsStorage<QColorDialog::ColorDialogOption>)QColorDialog::options(this);
  if (QVar2.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i !=
      (QFlagsStorage<QColorDialog::ColorDialogOption>)
      options.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
      super_QFlagsStorage<QColorDialog::ColorDialogOption>.i) {
    QColorDialogOptions::setOptions
              ((this_00->options).value.ptr,
               options.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
               super_QFlagsStorage<QColorDialog::ColorDialogOption>.i);
    if ((((uint)options.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                super_QFlagsStorage<QColorDialog::ColorDialogOption>.i & 4) != 0) &&
       ((this_00->super_QDialogPrivate).nativeDialogInUse == true)) {
      (this_00->super_QDialogPrivate).nativeDialogInUse = false;
      QColorDialogPrivate::initWidgets(this_00);
    }
    if ((this_00->super_QDialogPrivate).nativeDialogInUse == false) {
      (**(code **)(*(long *)&this_00->buttons->super_QWidget + 0x68))
                (this_00->buttons,
                 ((uint)options.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                        super_QFlagsStorage<QColorDialog::ColorDialogOption>.i & 2) == 0);
      QColorDialogPrivate::showAlpha
                (this_00,(bool)((byte)options.
                                      super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                                      super_QFlagsStorage<QColorDialog::ColorDialogOption>.i & 1));
      pQVar1 = this_00->eyeDropperButton;
      if (pQVar1 != (QPushButton *)0x0) {
        (**(code **)(*(long *)&(pQVar1->super_QAbstractButton).super_QWidget + 0x68))
                  (pQVar1,((uint)options.
                                 super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                                 super_QFlagsStorage<QColorDialog::ColorDialogOption>.i & 8) == 0);
        return;
      }
    }
  }
  return;
}

Assistant:

void QColorDialog::setOptions(ColorDialogOptions options)
{
    Q_D(QColorDialog);

    if (QColorDialog::options() == options)
        return;

    d->options->setOptions(QColorDialogOptions::ColorDialogOptions(int(options)));
    if ((options & DontUseNativeDialog) && d->nativeDialogInUse) {
        d->nativeDialogInUse = false;
        d->initWidgets();
    }
    if (!d->nativeDialogInUse) {
        d->buttons->setVisible(!(options & NoButtons));
        d->showAlpha(options & ShowAlphaChannel);
        if (d->eyeDropperButton)
            d->eyeDropperButton->setVisible(!(options & NoEyeDropperButton));
    }
}